

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

void aura_buffer_release(aura_buffer *buf)

{
  aura_node *node;
  aura_node *nd;
  aura_buffer *buf_local;
  
  node = buf->owner;
  if (buf->magic != 0xdeadc0de) {
    BUG(node,
        "FATAL: Attempting to release a buffer with invalid magic OR double free an aura_buffer");
  }
  list_add(&buf->qentry,&node->buffer_pool);
  node->num_buffers_in_pool = node->num_buffers_in_pool + 1;
  return;
}

Assistant:

void aura_buffer_release(struct aura_buffer *buf)
{
	/* Just put the buffer back into the pool at the very start */
#ifdef AURA_USE_BUFFER_POOL
	struct aura_node *nd = buf->owner;
	if (buf->magic != AURA_BUFFER_MAGIC_ID)
		BUG(nd,
		    "FATAL: Attempting to release a buffer with invalid magic OR double free an aura_buffer");

	list_add(&buf->qentry, &nd->buffer_pool);
	nd->num_buffers_in_pool++;
#else
	aura_buffer_destroy(buf);
#endif
}